

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O0

void Theta(Sarray *A,Sarray *B,vector<unsigned_long,_std::allocator<unsigned_long>_> *C,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *D)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  reference pvVar6;
  reference pvVar7;
  uint64_t uVar8;
  undefined4 local_38;
  undefined4 local_34;
  int y;
  int x_2;
  int x_1;
  int x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *D_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *C_local;
  Sarray *B_local;
  Sarray *A_local;
  
  for (x_2 = 0; x_2 < 5; x_2 = x_2 + 1) {
    pvVar6 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](A,(long)x_2);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,0);
    uVar1 = *pvVar7;
    pvVar6 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](A,(long)x_2);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,1);
    uVar2 = *pvVar7;
    pvVar6 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](A,(long)x_2);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,2);
    uVar3 = *pvVar7;
    pvVar6 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](A,(long)x_2);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,3);
    uVar4 = *pvVar7;
    pvVar6 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](A,(long)x_2);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,4);
    uVar5 = *pvVar7;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](C,(long)x_2);
    *pvVar7 = uVar1 ^ uVar2 ^ uVar3 ^ uVar4 ^ uVar5;
  }
  for (y = 0; y < 5; y = y + 1) {
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (C,(long)((y + 4) % 5));
    uVar1 = *pvVar7;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (C,(long)((y + 1) % 5));
    uVar8 = rot(*pvVar7,1);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](D,(long)y);
    *pvVar7 = uVar1 ^ uVar8;
  }
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
      pvVar6 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](A,(long)local_34);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar6,(long)local_38);
      uVar1 = *pvVar7;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (D,(long)local_34);
      uVar2 = *pvVar7;
      pvVar6 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](B,(long)local_34);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar6,(long)local_38);
      *pvVar7 = uVar1 ^ uVar2;
    }
  }
  return;
}

Assistant:

void Theta(Sarray &A, Sarray &B, vector<uint64_t> &C, vector<uint64_t> &D){
    for(int x=0;x<5;x++){
        C[x] = A[x][0]^A[x][1]^A[x][2]^A[x][3]^A[x][4];
    }

    for(int x=0;x<5;x++){
        D[x] = (C[(x+4)%5])^(rot(C[(x+1)%5],1));
    }

    for(int x=0;x<5;x++){
        for(int y=0;y<5;y++){
            B[x][y] = A[x][y] ^ D[x];
        }
    }
}